

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O1

void __thiscall
testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
Matcher(Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this,string *s)

{
  linked_ptr<const_testing::MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ptr;
  pointer pcVar1;
  long *local_88;
  long local_80;
  long local_78 [2];
  long *local_68 [2];
  long local_58 [2];
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_48
  ;
  
  (this->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).impl_.value_ =
       (MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  (this->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).impl_.link_.next_ =
       &(this->
        super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).impl_.link_;
  (this->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  )._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00145a08;
  pcVar1 = (s->_M_dataplus)._M_p;
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,pcVar1,pcVar1 + s->_M_string_length)
  ;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>((string *)local_68,local_88,local_80 + (long)local_88);
  internal::ComparisonBase::operator_cast_to_Matcher(&local_48,(ComparisonBase *)local_68);
  ptr = &local_48.
         super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .impl_;
  internal::
  linked_ptr<const_testing::MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->
               super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).impl_,ptr);
  local_48.
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00145bf8;
  internal::
  linked_ptr<const_testing::MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~linked_ptr(ptr);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  return;
}

Assistant:

Matcher<internal::string>::Matcher(const internal::string& s) { *this = Eq(s); }